

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O2

void h_predictor_32x8line(__m256i *row,uint8_t *dst,ptrdiff_t stride)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  int iVar3;
  bool bVar4;
  undefined1 auVar5 [64];
  undefined1 auVar6 [32];
  
  auVar5 = ZEXT1664((undefined1  [16])0x0);
  iVar3 = 4;
  auVar6[8] = 4;
  auVar6._0_8_ = 0x404040404040404;
  auVar6[9] = 4;
  auVar6[10] = 4;
  auVar6[0xb] = 4;
  auVar6[0xc] = 4;
  auVar6[0xd] = 4;
  auVar6[0xe] = 4;
  auVar6[0xf] = 4;
  auVar6[0x10] = 4;
  auVar6[0x11] = 4;
  auVar6[0x12] = 4;
  auVar6[0x13] = 4;
  auVar6[0x14] = 4;
  auVar6[0x15] = 4;
  auVar6[0x16] = 4;
  auVar6[0x17] = 4;
  auVar6[0x18] = 4;
  auVar6[0x19] = 4;
  auVar6[0x1a] = 4;
  auVar6[0x1b] = 4;
  auVar6[0x1c] = 4;
  auVar6[0x1d] = 4;
  auVar6[0x1e] = 4;
  auVar6[0x1f] = 4;
  while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    auVar1 = vpshufb_avx2((undefined1  [32])*row,auVar5._0_32_);
    auVar2 = vpermq_avx2(auVar1,0x44);
    auVar1 = vpermq_avx2(auVar1,0xee);
    *(undefined1 (*) [32])dst = auVar2;
    *(undefined1 (*) [32])(*(undefined1 (*) [32])dst + stride * 0x10) = auVar1;
    dst = *(undefined1 (*) [32])dst + stride;
    auVar1 = vpaddb_avx2(auVar5._0_32_,auVar6);
    auVar5 = ZEXT3264(auVar1);
  }
  return;
}

Assistant:

static inline void h_predictor_32x8line(const __m256i *row, uint8_t *dst,
                                        ptrdiff_t stride) {
  __m256i t[4];
  __m256i m = _mm256_setzero_si256();
  const __m256i inc = _mm256_set1_epi8(4);
  int i;

  for (i = 0; i < 4; i++) {
    t[i] = _mm256_shuffle_epi8(*row, m);
    __m256i r0 = _mm256_permute2x128_si256(t[i], t[i], 0);
    __m256i r1 = _mm256_permute2x128_si256(t[i], t[i], 0x11);
    _mm256_storeu_si256((__m256i *)dst, r0);
    _mm256_storeu_si256((__m256i *)(dst + (stride << 4)), r1);
    dst += stride;
    m = _mm256_add_epi8(m, inc);
  }
}